

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestOneof2::set_allocated_foo_lazy_message
          (TestOneof2 *this,TestOneof2_NestedMessage *foo_lazy_message)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_foo(this);
  if (foo_lazy_message != (TestOneof2_NestedMessage *)0x0) {
    submessage_arena =
         (Arena *)(foo_lazy_message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      foo_lazy_message =
           (TestOneof2_NestedMessage *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,(MessageLite *)foo_lazy_message,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 0xb;
    (this->field_0)._impl_.foo_.foo_message_ = &foo_lazy_message->super_Message;
  }
  return;
}

Assistant:

void TestOneof2::set_allocated_foo_lazy_message(::proto2_unittest::TestOneof2_NestedMessage* PROTOBUF_NULLABLE foo_lazy_message) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_foo();
  if (foo_lazy_message) {
    ::google::protobuf::Arena* submessage_arena = foo_lazy_message->GetArena();
    if (message_arena != submessage_arena) {
      foo_lazy_message = ::google::protobuf::internal::GetOwnedMessage(message_arena, foo_lazy_message, submessage_arena);
    }
    set_has_foo_lazy_message();
    _impl_.foo_.foo_lazy_message_ = foo_lazy_message;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestOneof2.foo_lazy_message)
}